

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase62::run(TestCase62 *this)

{
  PointerType PVar1;
  Orphanage OVar2;
  MessageSizeCounts MVar3;
  Builder root;
  MallocMessageBuilder builder;
  int local_1ac;
  PointerBuilder local_1a8;
  OrphanBuilder local_188;
  StructBuilder local_168;
  StructBuilder local_138;
  WordCountN<61,_uint64_t> local_108;
  uint local_100;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_188,&local_f8.super_MessageBuilder);
  local_168.data = local_188.capTable;
  local_168.segment = (SegmentBuilder *)local_188.tag.content;
  local_168.capTable = (CapTableBuilder *)local_188.segment;
  PointerBuilder::initStruct(&local_138,(PointerBuilder *)&local_168,(StructSize)0x10000);
  local_1a8.segment = local_138.segment;
  local_1a8.capTable = local_138.capTable;
  local_1a8.pointer = local_138.pointers;
  PVar1 = PointerBuilder::getPointerType(&local_1a8);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x42,ERROR,"\"failed: expected \" \"anyPointer.isNull()\"",
               (char (*) [37])"failed: expected anyPointer.isNull()");
  }
  local_188.capTable = (CapTableBuilder *)local_1a8.pointer;
  local_188.tag.content = (uint64_t)local_1a8.segment;
  local_188.segment = (SegmentBuilder *)local_1a8.capTable;
  PointerBuilder::initStruct(&local_168,(PointerBuilder *)&local_188,(StructSize)0x140006);
  OVar2 = MessageBuilder::getOrphanage(&local_f8.super_MessageBuilder);
  OrphanBuilder::initStruct((OrphanBuilder *)&local_168,OVar2.arena,OVar2.capTable,(StructSize)0x0);
  local_188.segment = (SegmentBuilder *)local_168.capTable;
  local_188.capTable = (CapTableBuilder *)local_168.data;
  local_188.location = (word *)local_168.pointers;
  local_188.tag.content = (uint64_t)local_168.segment;
  local_168.data = local_1a8.pointer;
  local_168.segment = local_1a8.segment;
  local_168.capTable = local_1a8.capTable;
  PointerBuilder::adopt((PointerBuilder *)&local_168,&local_188);
  PointerBuilder::asReader(&local_1a8);
  MVar3 = PointerReader::targetSize((PointerReader *)&local_168);
  if ((MVar3.wordCount != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1ac = 0;
    PointerBuilder::asReader(&local_1a8);
    MVar3 = PointerReader::targetSize((PointerReader *)&local_168);
    local_108 = MVar3.wordCount;
    local_100 = MVar3.capCount;
    kj::_::Debug::log<char_const(&)[60],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"(0) == (anyPointer.targetSize().wordCount)\", 0, anyPointer.targetSize().wordCount"
               ,(char (*) [60])"failed: expected (0) == (anyPointer.targetSize().wordCount)",
               &local_1ac,&local_108);
  }
  PVar1 = PointerBuilder::getPointerType(&local_1a8);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x47,ERROR,"\"failed: expected \" \"!(anyPointer.isNull())\"",
               (char (*) [40])"failed: expected !(anyPointer.isNull())");
  }
  if (local_188.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_188);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, EmptyStructOverwrite) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();
  auto anyPointer = root.getAnyPointerField();
  EXPECT_TRUE(anyPointer.isNull());
  anyPointer.initAs<TestAllTypes>();
  auto orphan = builder.getOrphanage().newOrphan<test::TestEmptyStruct>();
  anyPointer.adopt(kj::mv(orphan));
  EXPECT_EQ(0, anyPointer.targetSize().wordCount);
  EXPECT_FALSE(anyPointer.isNull());
}